

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_RegisterString::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  byte bVar3;
  Template *pTVar4;
  ulong uVar5;
  TemplateString local_2a0;
  TemplateString local_280;
  TemplateString local_260;
  undefined8 local_240;
  TemplateDictionary *sub_dict;
  allocator local_221;
  string local_220 [8];
  string expected;
  TemplateString local_200;
  TemplateDictionary local_1e0 [8];
  TemplateDictionary dict;
  TemplateString local_170;
  TemplateString local_150;
  TemplateString local_130;
  TemplateString local_110;
  TemplateString local_f0;
  TemplateString local_d0;
  TemplateString local_b0;
  Template *local_90;
  Template *tpl;
  TemplateString local_68;
  TemplateString local_48;
  TemplateString local_28;
  
  ctemplate::TemplateString::TemplateString(&local_28,"file1");
  ctemplate::TemplateString::TemplateString(&local_48,"Some text");
  bVar3 = ctemplate::Template::StringToTemplateCache(&local_28,&local_48);
  if (((bVar3 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x830,
           "Template::StringToTemplateCache(\"file1\", \"Some text\")");
    ctemplate::TemplateString::TemplateString(&local_68,"file1");
    ctemplate::TemplateString::TemplateString((TemplateString *)&tpl,"Some text");
    uVar5 = ctemplate::Template::StringToTemplateCache(&local_68,(TemplateString *)&tpl);
    if ((uVar5 & 1) == 0) {
      __assert_fail("Template::StringToTemplateCache(\"file1\", \"Some text\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x830,"static void Test_Template_RegisterString::Run()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_b0,"file1");
  local_90 = (Template *)ctemplate::Template::GetTemplate(&local_b0,STRIP_WHITESPACE);
  if (local_90 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x832,"tpl");
    if (local_90 != (Template *)0x0) {
      exit(1);
    }
    __assert_fail("tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x832,"static void Test_Template_RegisterString::Run()");
  }
  ctemplate::TemplateString::TemplateString(&local_d0,"file1");
  pTVar4 = (Template *)ctemplate::Template::GetTemplate(&local_d0,STRIP_WHITESPACE);
  if (pTVar4 != local_90) {
    printf("ASSERT FAILED, line %d: %s\n",0x833,
           "Template::GetTemplate(\"file1\", STRIP_WHITESPACE) == tpl");
    ctemplate::TemplateString::TemplateString(&local_f0,"file1");
    pTVar4 = (Template *)ctemplate::Template::GetTemplate(&local_f0,STRIP_WHITESPACE);
    if (pTVar4 == local_90) {
      exit(1);
    }
    __assert_fail("Template::GetTemplate(\"file1\", STRIP_WHITESPACE) == tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x833,"static void Test_Template_RegisterString::Run()");
  }
  ctemplate::TemplateString::TemplateString(&local_110,"file2");
  ctemplate::TemplateString::TemplateString(&local_130,"Top {{>INC}}");
  bVar3 = ctemplate::Template::StringToTemplateCache(&local_110,&local_130);
  if (((bVar3 ^ 0xff) & 1) == 0) {
    ctemplate::TemplateString::TemplateString(&local_200,"dict");
    ctemplate::TemplateDictionary::TemplateDictionary(local_1e0,&local_200,(UnsafeArena *)0x0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"Some text",&local_221);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    ctemplate::AssertExpandIs(local_90,local_1e0,(string *)local_220,true);
    ctemplate::TemplateString::TemplateString(&local_260,"INC");
    TVar1.length_ = local_260.length_;
    TVar1.ptr_ = local_260.ptr_;
    TVar1.is_immutable_ = local_260.is_immutable_;
    TVar1._17_7_ = local_260._17_7_;
    TVar1.id_ = local_260.id_;
    local_240 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
    ctemplate::TemplateString::TemplateString(&local_280,"file1");
    TVar2.length_ = local_280.length_;
    TVar2.ptr_ = local_280.ptr_;
    TVar2.is_immutable_ = local_280.is_immutable_;
    TVar2._17_7_ = local_280._17_7_;
    TVar2.id_ = local_280.id_;
    ctemplate::TemplateDictionary::SetFilename(TVar2);
    ctemplate::TemplateString::TemplateString(&local_2a0,"file2");
    local_90 = (Template *)ctemplate::Template::GetTemplate(&local_2a0,STRIP_WHITESPACE);
    std::__cxx11::string::operator=(local_220,"Top Some text");
    ctemplate::AssertExpandIs(local_90,local_1e0,(string *)local_220,true);
    std::__cxx11::string::~string(local_220);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_1e0);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x835,
         "Template::StringToTemplateCache(\"file2\", \"Top {{>INC}}\")");
  ctemplate::TemplateString::TemplateString(&local_150,"file2");
  ctemplate::TemplateString::TemplateString(&local_170,"Top {{>INC}}");
  uVar5 = ctemplate::Template::StringToTemplateCache(&local_150,&local_170);
  if ((uVar5 & 1) == 0) {
    __assert_fail("Template::StringToTemplateCache(\"file2\", \"Top {{>INC}}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x835,"static void Test_Template_RegisterString::Run()");
  }
  exit(1);
}

Assistant:

TEST(Template, RegisterString) {
  ASSERT(Template::StringToTemplateCache("file1", "Some text"));
  Template* tpl = Template::GetTemplate("file1", STRIP_WHITESPACE);
  ASSERT(tpl);
  ASSERT(Template::GetTemplate("file1", STRIP_WHITESPACE) == tpl);

  ASSERT(Template::StringToTemplateCache("file2", "Top {{>INC}}"));

  TemplateDictionary dict("dict");
  string expected = "Some text";
  AssertExpandIs(tpl, &dict, expected, true);

  TemplateDictionary* sub_dict = dict.AddIncludeDictionary("INC");
  sub_dict->SetFilename("file1");
  tpl = Template::GetTemplate("file2", STRIP_WHITESPACE);
  expected = "Top Some text";
  AssertExpandIs(tpl, &dict, expected, true);
}